

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTPNIfnil::gen_code(CTPNIfnil *this,int discard,int for_condition)

{
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  CTcCodeLabel *lbl_end;
  uchar in_stack_000000cf;
  CTcGenTarg *in_stack_000000d0;
  uchar in_stack_ffffffffffffffdf;
  
  (**(code **)**(undefined8 **)(in_RDI + 8))(*(undefined8 **)(in_RDI + 8),0);
  if (in_ESI == 0) {
    CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
    CTcGenTarg::note_push((CTcGenTarg *)0x2d43a2);
  }
  CTcPrsNode::gen_jump_ahead(in_stack_ffffffffffffffdf);
  CTcGenTarg::note_pop((CTcGenTarg *)0x2d43c0);
  if (in_ESI == 0) {
    CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
    CTcGenTarg::note_pop((CTcGenTarg *)0x2d43ea);
  }
  (**(code **)**(undefined8 **)(in_RDI + 0x10))(*(undefined8 **)(in_RDI + 0x10),in_ESI,in_EDX);
  CTcPrsNode::def_label_pos((CTcCodeLabel *)CONCAT44(in_ESI,in_EDX));
  return;
}

Assistant:

void CTPNIfnil::gen_code(int discard, int for_condition)
{
    /* generate the first operand */
    first_->gen_code(FALSE, FALSE);

    /* check to see if we're keeping the result or merely testing it */
    if (!discard)
    {
        /* we're keep the result - make a copy for the JNOTNIL */
        G_cg->write_op(OPC_DUP);
        G_cg->note_push();
    }

    /* if it's not nil, we're done - jump to the end of the operator */
    CTcCodeLabel *lbl_end = gen_jump_ahead(OPC_JNOTNIL);
    G_cg->note_pop();

    /* 
     *   We're on the 'nil' branch now, meaning we're not going to yield the
     *   first value after all.  If we're yielding anything, discard the
     *   extra yielding copy we made of the first value. 
     */
    if (!discard)
    {
        G_cg->write_op(OPC_DISC);
        G_cg->note_pop();
    }

    /* generate the 'nil' branch, yielding the second operand */
    second_->gen_code(discard, for_condition);

    /* this is the end of the test - generate the end label */
    def_label_pos(lbl_end);
}